

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_printf.h
# Opt level: O1

char * stbsp__clamp_callback(char *buf,void *user,int len)

{
  char *pcVar1;
  char cVar2;
  char *d;
  char *pcVar3;
  stbsp__context *c;
  
  if (*(int *)((long)user + 8) < len) {
    len = *(int *)((long)user + 8);
  }
  if (len != 0) {
    pcVar3 = *user;
    if (pcVar3 != buf) {
      pcVar1 = buf + len;
      do {
        cVar2 = *buf;
        buf = buf + 1;
        *pcVar3 = cVar2;
        pcVar3 = pcVar3 + 1;
      } while (buf < pcVar1);
    }
    *(long *)user = *user + (long)len;
    *(int *)((long)user + 8) = *(int *)((long)user + 8) - len;
  }
  if (0 < *(int *)((long)user + 8)) {
    if (0x1ff < *(int *)((long)user + 8)) {
      return *user;
    }
    return (char *)((long)user + 0xc);
  }
  return (char *)0x0;
}

Assistant:

static char *stbsp__clamp_callback(char *buf, void *user, int len)
{
   stbsp__context *c = (stbsp__context *)user;

   if (len > c->count)
      len = c->count;

   if (len) {
      if (buf != c->buf) {
         char *s, *d, *se;
         d = c->buf;
         s = buf;
         se = buf + len;
         do {
            *d++ = *s++;
         } while (s < se);
      }
      c->buf += len;
      c->count -= len;
   }

   if (c->count <= 0)
      return 0;
   return (c->count >= STB_SPRINTF_MIN) ? c->buf : c->tmp; // go direct into buffer if you can
}